

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

bool legacy::findSecondarySlicingCriteria
               (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                *criteria_nodes,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *secondaryControlCriteria,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *secondaryDataCriteria)

{
  bool bVar1;
  BBlock<dg::LLVMNode> *pBVar2;
  reference ppBVar3;
  reference ppLVar4;
  reference ppLVar5;
  pair<std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>,_bool> pVar6;
  BBlock<dg::LLVMNode> *exit_1;
  LLVMDependenceGraph *dg_1;
  iterator __end5;
  iterator __begin5;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *__range5;
  LLVMNode *nd_1;
  iterator __end3;
  iterator __begin3;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *__range3;
  BBlock<dg::LLVMNode> *pred;
  iterator __end2_1;
  iterator __begin2_1;
  PredContainerT *__range2_1;
  BBlock<dg::LLVMNode> *cur;
  BBlock<dg::LLVMNode> *exit;
  LLVMDependenceGraph *dg;
  iterator __end4;
  iterator __begin4;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *__range4;
  LLVMNode *nd;
  iterator __end2;
  iterator __begin2;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *__range2;
  LLVMNode **c;
  iterator __end1;
  iterator __begin1;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *__range1;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> tmp;
  QueueLIFO<dg::BBlock<dg::LLVMNode>_*> queue;
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  visited;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *in_stack_fffffffffffffdd8;
  _Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffdf9;
  _Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe09;
  _Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> in_stack_fffffffffffffe10;
  _Self local_1d0;
  _Self local_1c8;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *local_1c0;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *local_1b8;
  _Self local_1b0;
  _Self local_1a8;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *local_1a0;
  BBlock<dg::LLVMNode> *local_198;
  _Self local_190;
  _Self local_188;
  PredContainerT *local_180;
  BBlock<dg::LLVMNode> *local_178;
  _Base_ptr local_170;
  undefined1 local_168;
  _Base_ptr local_160;
  undefined1 local_158;
  BBlock<dg::LLVMNode> *local_150;
  DependenceGraph<dg::LLVMNode> *local_148;
  _Self local_140;
  _Self local_138;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *local_130;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *local_128;
  _Self local_120;
  _Self local_118;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *local_110;
  _Base_ptr local_108;
  undefined1 local_100;
  BBlock<dg::LLVMNode> *local_f8;
  BBlock<dg::LLVMNode> *local_f0;
  reference local_e8;
  _Self local_e0;
  _Self local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [200];
  
  std::
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::set((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
         *)0x1df0bc);
  ::dg::ADT::QueueLIFO<dg::BBlock<dg::LLVMNode>_*>::QueueLIFO
            ((QueueLIFO<dg::BBlock<dg::LLVMNode>_*> *)0x1df0c9);
  std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::set
            ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
             in_stack_fffffffffffffde0._M_node,
             (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
             in_stack_fffffffffffffdd8);
  local_d0 = local_c8;
  local_d8._M_node =
       (_Base_ptr)
       std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::begin
                 ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *
                  )in_stack_fffffffffffffdd8);
  local_e0._M_node =
       (_Base_ptr)
       std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::end
                 ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *
                  )in_stack_fffffffffffffdd8);
  do {
    bVar1 = std::operator!=(&local_d8,&local_e0);
    if (!bVar1) {
      while (bVar1 = ::dg::ADT::QueueLIFO<dg::BBlock<dg::LLVMNode>_*>::empty
                               ((QueueLIFO<dg::BBlock<dg::LLVMNode>_*> *)0x1df3da),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        local_178 = ::dg::ADT::QueueLIFO<dg::BBlock<dg::LLVMNode>_*>::pop
                              ((QueueLIFO<dg::BBlock<dg::LLVMNode>_*> *)
                               in_stack_fffffffffffffde0._M_node);
        local_180 = ::dg::BBlock<dg::LLVMNode>::predecessors(local_178);
        local_188._M_node =
             (_Base_ptr)
             ::dg::DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::begin
                       ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_stack_fffffffffffffdd8);
        local_190._M_node =
             (_Base_ptr)
             ::dg::DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::end
                       ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_stack_fffffffffffffdd8);
        while (bVar1 = std::operator!=(&local_188,&local_190), bVar1) {
          ppBVar3 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator*
                              ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)0x1df464);
          local_198 = *ppBVar3;
          local_1a0 = ::dg::BBlock<dg::LLVMNode>::getNodes_abi_cxx11_(local_198);
          local_1a8._M_node =
               (_List_node_base *)
               std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::begin
                         (in_stack_fffffffffffffdd8);
          local_1b0._M_node =
               (_List_node_base *)
               std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::end
                         (in_stack_fffffffffffffdd8);
          while (bVar1 = std::operator!=(&local_1a8,&local_1b0), bVar1) {
            ppLVar4 = std::_List_iterator<dg::LLVMNode_*>::operator*
                                ((_List_iterator<dg::LLVMNode_*> *)0x1df4d3);
            local_1b8 = (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)*ppLVar4;
            bVar1 = ::dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::hasSubgraphs
                              ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)
                               0x1df4e5);
            if (bVar1) {
              local_1c0 = ::dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::
                          getSubgraphs(local_1b8);
              local_1c8._M_node =
                   (_Base_ptr)
                   std::
                   set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                   ::begin((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                            *)in_stack_fffffffffffffdd8);
              local_1d0._M_node =
                   (_Base_ptr)
                   std::
                   set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                   ::end((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                          *)in_stack_fffffffffffffdd8);
              while (bVar1 = std::operator!=(&local_1c8,&local_1d0), bVar1) {
                ppLVar5 = std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator*
                                    ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)0x1df53a)
                ;
                ::dg::DependenceGraph<dg::LLVMNode>::getExitBB
                          ((DependenceGraph<dg::LLVMNode> *)*ppLVar5);
                pVar6 = std::
                        set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                        ::insert((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                                  *)in_stack_fffffffffffffe00._M_node,
                                 (value_type *)
                                 CONCAT71(in_stack_fffffffffffffdf9,in_stack_fffffffffffffdf8));
                in_stack_fffffffffffffe00 = pVar6.first._M_node;
                in_stack_fffffffffffffe08 = pVar6.second;
                in_stack_fffffffffffffe10._M_node = in_stack_fffffffffffffe00._M_node;
                if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ::dg::ADT::QueueLIFO<dg::BBlock<dg::LLVMNode>_*>::push
                            ((QueueLIFO<dg::BBlock<dg::LLVMNode>_*> *)
                             in_stack_fffffffffffffde0._M_node,
                             (BBlock<dg::LLVMNode> **)in_stack_fffffffffffffdd8);
                }
                std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator++
                          ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)
                           in_stack_fffffffffffffde0._M_node);
              }
            }
            checkSecondarySlicingCrit
                      ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                        *)in_stack_fffffffffffffe10._M_node,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT71(in_stack_fffffffffffffe09,in_stack_fffffffffffffe08),
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffe00._M_node,
                       (LLVMNode *)CONCAT71(in_stack_fffffffffffffdf9,in_stack_fffffffffffffdf8));
            std::_List_iterator<dg::LLVMNode_*>::operator++(&local_1a8);
          }
          pVar6 = std::
                  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                  ::insert((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                            *)in_stack_fffffffffffffe00._M_node,
                           (value_type *)
                           CONCAT71(in_stack_fffffffffffffdf9,in_stack_fffffffffffffdf8));
          in_stack_fffffffffffffde0 = pVar6.first._M_node;
          in_stack_fffffffffffffdf8 = pVar6.second;
          if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            ::dg::ADT::QueueLIFO<dg::BBlock<dg::LLVMNode>_*>::push
                      ((QueueLIFO<dg::BBlock<dg::LLVMNode>_*> *)in_stack_fffffffffffffde0._M_node,
                       (BBlock<dg::LLVMNode> **)in_stack_fffffffffffffdd8);
          }
          std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator++
                    ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)
                     in_stack_fffffffffffffde0._M_node);
        }
      }
      std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::~set
                ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
                 0x1df650);
      ::dg::ADT::QueueLIFO<dg::BBlock<dg::LLVMNode>_*>::~QueueLIFO
                ((QueueLIFO<dg::BBlock<dg::LLVMNode>_*> *)0x1df65d);
      std::
      set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
      ::~set((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
              *)0x1df66a);
      return true;
    }
    local_e8 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                         ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1df143);
    pBVar2 = ::dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getBBlock
                       ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)*local_e8);
    if (pBVar2 != (BBlock<dg::LLVMNode> *)0x0) {
      local_f0 = ::dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getBBlock
                           ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)*local_e8)
      ;
      ::dg::ADT::QueueLIFO<dg::BBlock<dg::LLVMNode>_*>::push
                ((QueueLIFO<dg::BBlock<dg::LLVMNode>_*> *)in_stack_fffffffffffffde0._M_node,
                 (BBlock<dg::LLVMNode> **)in_stack_fffffffffffffdd8);
      local_f8 = ::dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getBBlock
                           ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)*local_e8)
      ;
      pVar6 = std::
              set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
              ::insert((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                        *)in_stack_fffffffffffffe00._M_node,
                       (value_type *)CONCAT71(in_stack_fffffffffffffdf9,in_stack_fffffffffffffdf8));
      local_108 = (_Base_ptr)pVar6.first._M_node;
      local_100 = pVar6.second;
      pBVar2 = ::dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getBBlock
                         ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)*local_e8);
      local_110 = ::dg::BBlock<dg::LLVMNode>::getNodes_abi_cxx11_(pBVar2);
      local_118._M_node =
           (_List_node_base *)
           std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::begin
                     (in_stack_fffffffffffffdd8);
      local_120._M_node =
           (_List_node_base *)
           std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::end
                     (in_stack_fffffffffffffdd8);
      while (bVar1 = std::operator!=(&local_118,&local_120), bVar1) {
        ppLVar4 = std::_List_iterator<dg::LLVMNode_*>::operator*
                            ((_List_iterator<dg::LLVMNode_*> *)0x1df244);
        local_128 = (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)*ppLVar4;
        if (local_128 == (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)*local_e8)
        break;
        bVar1 = ::dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::hasSubgraphs
                          ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)0x1df276);
        if (bVar1) {
          local_130 = ::dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getSubgraphs
                                (local_128);
          local_138._M_node =
               (_Base_ptr)
               std::
               set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
               ::begin((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                        *)in_stack_fffffffffffffdd8);
          local_140._M_node =
               (_Base_ptr)
               std::
               set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
               ::end((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                      *)in_stack_fffffffffffffdd8);
          while (bVar1 = std::operator!=(&local_138,&local_140), bVar1) {
            ppLVar5 = std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator*
                                ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)0x1df2e9);
            local_148 = (DependenceGraph<dg::LLVMNode> *)*ppLVar5;
            local_150 = ::dg::DependenceGraph<dg::LLVMNode>::getExitBB(local_148);
            pVar6 = std::
                    set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                    ::insert((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                              *)in_stack_fffffffffffffe00._M_node,
                             (value_type *)
                             CONCAT71(in_stack_fffffffffffffdf9,in_stack_fffffffffffffdf8));
            local_170 = (_Base_ptr)pVar6.first._M_node;
            local_168 = pVar6.second;
            local_160 = local_170;
            local_158 = local_168;
            if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              ::dg::ADT::QueueLIFO<dg::BBlock<dg::LLVMNode>_*>::push
                        ((QueueLIFO<dg::BBlock<dg::LLVMNode>_*> *)in_stack_fffffffffffffde0._M_node,
                         (BBlock<dg::LLVMNode> **)in_stack_fffffffffffffdd8);
            }
            std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator++
                      ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)
                       in_stack_fffffffffffffde0._M_node);
          }
        }
        checkSecondarySlicingCrit
                  ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                    *)in_stack_fffffffffffffe10._M_node,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT71(in_stack_fffffffffffffe09,in_stack_fffffffffffffe08),
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe00._M_node,
                   (LLVMNode *)CONCAT71(in_stack_fffffffffffffdf9,in_stack_fffffffffffffdf8));
        std::_List_iterator<dg::LLVMNode_*>::operator++(&local_118);
      }
    }
    std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
              ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_stack_fffffffffffffde0._M_node);
  } while( true );
}

Assistant:

static bool findSecondarySlicingCriteria(
        std::set<LLVMNode *> &criteria_nodes,
        const std::set<std::string> &secondaryControlCriteria,
        const std::set<std::string> &secondaryDataCriteria) {
    // FIXME: do this more efficiently (and use the new DFS class)
    std::set<LLVMBBlock *> visited;
    ADT::QueueLIFO<LLVMBBlock *> queue;
    auto tmp = criteria_nodes;
    for (const auto &c : tmp) {
        // the criteria may be a global variable and in that
        // case it has no basic block (but also no predecessors,
        // so we can skip it)
        if (!c->getBBlock())
            continue;

        queue.push(c->getBBlock());
        visited.insert(c->getBBlock());

        for (auto *nd : c->getBBlock()->getNodes()) {
            if (nd == c)
                break;

            if (nd->hasSubgraphs()) {
                // we search interprocedurally
                for (auto *dg : nd->getSubgraphs()) {
                    auto *exit = dg->getExitBB();
                    assert(exit && "No exit BB in a graph");
                    if (visited.insert(exit).second)
                        queue.push(exit);
                }
            }

            checkSecondarySlicingCrit(criteria_nodes, secondaryControlCriteria,
                                      secondaryDataCriteria, nd);
        }
    }

    // get basic blocks
    while (!queue.empty()) {
        auto *cur = queue.pop();
        for (auto *pred : cur->predecessors()) {
            for (auto *nd : pred->getNodes()) {
                if (nd->hasSubgraphs()) {
                    // we search interprocedurally
                    for (auto *dg : nd->getSubgraphs()) {
                        auto *exit = dg->getExitBB();
                        assert(exit && "No exit BB in a graph");
                        if (visited.insert(exit).second)
                            queue.push(exit);
                    }
                }

                checkSecondarySlicingCrit(criteria_nodes,
                                          secondaryControlCriteria,
                                          secondaryDataCriteria, nd);
            }
            if (visited.insert(pred).second)
                queue.push(pred);
        }
    }

    return true;
}